

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

void nsync_mu_lock_slow_(nsync_mu *mu,waiter *w,uint32_t clear,lock_type *l_type)

{
  nsync_dll_element_ *e;
  uint uVar1;
  uint attempts;
  nsync_dll_list_ pnVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int local_44;
  
  w->cv_mu = (nsync_mu_s_ *)0x0;
  (w->cond).eq = (_func_int_void_ptr_void_ptr *)0x0;
  (w->cond).f = (_func_int_void_ptr *)0x0;
  (w->cond).v = (void *)0x0;
  w->l_type = l_type;
  uVar4 = l_type->zero_to_acquire & 0xffffff9f;
  if (clear == 0) {
    uVar4 = l_type->zero_to_acquire;
  }
  e = &(w->nw).q;
  local_44 = 0;
  uVar3 = 0;
  attempts = 0;
  do {
    uVar1 = mu->word;
    if ((uVar1 & uVar4) == 0) {
      LOCK();
      bVar5 = uVar1 == mu->word;
      if (bVar5) {
        mu->word = ~(l_type->clear_on_acquire | uVar3 | clear) & l_type->add_to_acquire + uVar1;
      }
      UNLOCK();
      if (bVar5) {
        return;
      }
    }
    else if ((uVar1 & 2) == 0) {
      LOCK();
      bVar5 = uVar1 == mu->word;
      if (bVar5) {
        mu->word = ~clear & (l_type->set_when_waiting | uVar1 | uVar3 | 2) & 0xffffff7f;
      }
      UNLOCK();
      if (bVar5) {
        (w->nw).waiting = 1;
        if (local_44 == 0) {
          pnVar2 = nsync_dll_make_last_in_list_(mu->waiters,e);
        }
        else {
          pnVar2 = nsync_dll_make_first_in_list_(mu->waiters,e);
        }
        mu->waiters = pnVar2;
        mu_release_spinlock(mu);
        while ((w->nw).waiting != 0) {
          nsync_mu_semaphore_p(&w->sem);
        }
        local_44 = local_44 + 1;
        if (local_44 == 0x1e) {
          uVar3 = 0x40;
        }
        uVar4 = uVar4 & 0xffffff9f;
        attempts = 0;
        clear = 8;
      }
    }
    attempts = nsync_spin_delay_(attempts);
  } while( true );
}

Assistant:

void nsync_mu_lock_slow_ (nsync_mu *mu, waiter *w, uint32_t clear, lock_type *l_type) {
	uint32_t zero_to_acquire;
	uint32_t wait_count;
	uint32_t long_wait;
	unsigned attempts = 0; /* attempt count; used for spinloop backoff */
	w->cv_mu = NULL;      /* not a cv wait */
	w->cond.f = NULL; /* Not using a conditional critical section. */
	w->cond.v = NULL;
	w->cond.eq = NULL;
	w->l_type = l_type;
	zero_to_acquire = l_type->zero_to_acquire;
	if (clear != 0) {
		/* Only the constraints of mutual exclusion should stop a designated waker. */
		zero_to_acquire &= ~(MU_WRITER_WAITING | MU_LONG_WAIT);
	}
	wait_count = 0; /* number of times we waited, and were woken. */
	long_wait = 0; /* set to MU_LONG_WAIT when wait_count gets large */
	for (;;) {
		uint32_t old_word = ATM_LOAD (&mu->word);
		if ((old_word & zero_to_acquire) == 0) {
			/* lock can be acquired; try to acquire, possibly
			   clearing MU_DESIG_WAKER and MU_LONG_WAIT.  */
			if (ATM_CAS_ACQ (&mu->word, old_word,
					 (old_word+l_type->add_to_acquire) &
					  ~(clear|long_wait|l_type->clear_on_acquire))) {
				return;
			}
		} else if ((old_word&MU_SPINLOCK) == 0 &&
			   ATM_CAS_ACQ (&mu->word, old_word,
					(old_word|MU_SPINLOCK|long_wait|
					 l_type->set_when_waiting) & ~(clear | MU_ALL_FALSE))) {

			/* Spinlock is now held, and lock is held by someone
			   else; MU_WAITING has also been set; queue ourselves.
			   There's no need to adjust same_condition here,
			   because w.condition==NULL.  */
			ATM_STORE (&w->nw.waiting, 1);
			if (wait_count == 0) {
				/* first wait goes to end of queue */
				mu->waiters = nsync_dll_make_last_in_list_ (mu->waiters,
								            &w->nw.q);
			} else {
				/* subsequent waits go to front of queue */
				mu->waiters = nsync_dll_make_first_in_list_ (mu->waiters,
								             &w->nw.q);
			}

			/* Release spinlock.  Cannot use a store here, because
			   the current thread does not hold the mutex.  If
			   another thread were a designated waker, the mutex
			   holder could be concurrently unlocking, even though
			   we hold the spinlock. */
			mu_release_spinlock (mu);

			/* wait until awoken. */
			while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
				nsync_mu_semaphore_p (&w->sem);
			}
			wait_count++;
			/* If the thread has been woken more than this many
			   times, and still not acquired, it sets the
			   MU_LONG_WAIT bit to prevent thread that have not
			   waited from acquiring.  This is the starvation
			   avoidance mechanism.  The number is fairly high so
			   that we continue to benefit from the throughput of
			   not having running threads wait unless absolutely
			   necessary.  */
			if (wait_count == LONG_WAIT_THRESHOLD) { /* repeatedly woken */
				long_wait = MU_LONG_WAIT; /* force others to wait at least once */
			}

			attempts = 0;
			clear = MU_DESIG_WAKER;
			/* Threads that have been woken at least once don't care
			   about waiting writers or long waiters. */
			zero_to_acquire &= ~(MU_WRITER_WAITING | MU_LONG_WAIT);
		}
		attempts = nsync_spin_delay_ (attempts);
	}
}